

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

chunk * gauntlet_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  int16_t iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  wchar_t x0;
  wchar_t wVar9;
  chunk *c;
  chunk *c_00;
  chunk *c_01;
  loc lVar10;
  loc_conflict lVar11;
  loc lVar12;
  char *pcVar13;
  chunk *pcVar14;
  wchar_t wVar15;
  uint uVar16;
  int iVar17;
  wchar_t wVar18;
  wchar_t h;
  wchar_t wVar19;
  
  uVar5 = Rand_div(5);
  uVar6 = Rand_div(10);
  uVar1 = z_info->dungeon_hgt;
  uVar7 = Rand_div(uVar5 * -2 + 0x14);
  uVar2 = z_info->dungeon_wid;
  uVar8 = Rand_div(uVar6 * -2 + 0x18);
  if (dun->persist == true) {
    *p_error = "no gauntlet levels in persistent dungeons";
    return (chunk *)0x0;
  }
  c = labyrinth_chunk(p,uVar5 * 2 + L'\x05',uVar6 * 2 + L'\x15',false,false);
  if (c == (chunk *)0x0) {
    pcVar13 = "labyrinth chunk could not be generated";
  }
  else {
    h = uVar1 - uVar7;
    iVar17 = (uint)uVar2 + uVar6 * -2;
    wVar15 = ((iVar17 - (iVar17 + -0x17 >> 0x1f)) + -0x17 >> 1) - uVar8;
    c_00 = cavern_chunk(p,h,wVar15,(connector *)0x0);
    if (c_00 == (chunk *)0x0) {
      uncreate_artifacts((chunk_conflict *)c);
      cave_free((chunk_conflict *)c);
      pcVar13 = "left cavern chunk could not be generated";
    }
    else {
      c_01 = cavern_chunk(p,h,wVar15,(connector *)0x0);
      if (c_01 != (chunk *)0x0) {
        wVar15 = c_00->width;
        x0 = c->width + wVar15;
        generate_mark(c_00,L'\0',L'\0',c_00->height + L'\xffffffff',wVar15 + L'\xffffffff',L'\x0f');
        generate_mark(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x10');
        generate_mark(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x0f');
        wVar18 = FEAT_MORE;
        wVar9 = rand_range(2,3);
        alloc_stairs((chunk_conflict *)c_01,wVar18,wVar9,L'\0',false,(connector *)0x0);
        wVar18 = FEAT_LESS;
        wVar9 = rand_range(1,3);
        alloc_stairs((chunk_conflict *)c_00,wVar18,wVar9,L'\0',false,(connector *)0x0);
        uVar5 = Rand_div(c->height + L'\xfffffffe');
        lVar10 = (loc)loc(0,uVar5 + 1);
        uVar16 = 0xffffffff;
LAB_0014e413:
        lVar11 = loc(1,0);
        lVar12 = (loc)loc_sum((loc_conflict)lVar10,lVar11);
        _Var3 = square_isperm((chunk_conflict *)c,lVar12);
        if (_Var3) goto code_r0x0014e43d;
        square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
        wVar18 = c->width;
        uVar5 = Rand_div(c->height + L'\xfffffffe');
        lVar10 = (loc)loc(wVar18 + L'\xffffffff',uVar5 + 1);
        iVar17 = 0x14;
        do {
          lVar11 = loc(-1,0);
          lVar12 = (loc)loc_sum((loc_conflict)lVar10,lVar11);
          _Var3 = square_isperm((chunk_conflict *)c,lVar12);
          if (!_Var3) {
            square_set_feat((chunk_conflict *)c,lVar10,FEAT_GRANITE);
            uVar16._0_2_ = p->depth;
            uVar16._2_2_ = p->recall[0];
            if ((ushort)((undefined2)uVar16 - 0x21) < 0xffe5) {
              uVar5 = (uint)(5 < (short)(undefined2)uVar16) * 4 + 1;
            }
            else {
              uVar5 = (uVar16 & 0xff) / 6;
            }
            pcVar14 = c_00;
            if (p->upkeep->create_stair == FEAT_MORE) {
              pcVar14 = c_01;
            }
            _Var3 = new_player_spot((chunk_conflict *)pcVar14,p);
            if (!_Var3) {
              uncreate_artifacts((chunk_conflict *)c);
              cave_free((chunk_conflict *)c);
              uncreate_artifacts((chunk_conflict *)c_00);
              cave_free((chunk_conflict *)c_00);
              uncreate_artifacts((chunk_conflict *)c_01);
              cave_free((chunk_conflict *)c_01);
              *p_error = "could not place player";
              return (chunk *)0x0;
            }
            iVar17 = (p->grid).x;
            wVar18 = (p->grid).y;
            wVar9 = x0;
            if (pcVar14 == c_01) {
              wVar9 = L'\0';
            }
            uVar1 = z_info->level_monster_min;
            uVar6 = Rand_div(4);
            if (0 < (int)(uVar5 + uVar6 + 1 + (uint)uVar1)) {
              wVar19 = L'\0';
              if (pcVar14 == c_01) {
                wVar19 = x0;
              }
              lVar10.x = wVar19 + iVar17;
              lVar10.y = wVar18;
              uVar16 = (uint)uVar1 + uVar6 + uVar5 + 2;
              do {
                pick_and_place_distant_monster(c_00,lVar10,L'\0',true,c_00->depth);
                uVar16 = uVar16 - 1;
              } while (1 < uVar16);
            }
            uVar1 = z_info->level_monster_min;
            uVar6 = Rand_div(4);
            if (0 < (int)(uVar5 + 1 + uVar6 + (uint)uVar1)) {
              lVar12.y = wVar18;
              lVar12.x = iVar17 - wVar9;
              uVar16 = (uint)uVar1 + uVar6 + uVar5 + 2;
              do {
                pick_and_place_distant_monster(c_01,lVar12,L'\0',true,c_01->depth);
                uVar16 = uVar16 - 1;
              } while (1 < uVar16);
            }
            uVar1 = z_info->level_monster_min;
            uVar6 = Rand_div(6);
            do {
              set_pit_type(c->depth,L'\0');
              _Var3 = mon_restrict(dun->pit_type->name,c->depth,c->depth,true);
            } while (!_Var3);
            if ((player->opts).opt[0x18] == true) {
              msg("Gauntlet - %s",dun->pit_type->name);
            }
            wVar18 = c->height / 2;
            wVar9 = c->width / 2;
            spread_monsters(c,dun->pit_type->name,c->depth,uVar5 + 1 + uVar6 + (uint)uVar1,wVar18,
                            wVar9,wVar18,wVar9,'\x06');
            mon_restrict((char *)0x0,c->depth,c->depth,false);
            pcVar14 = (chunk *)cave_new(h,c->width + c_00->width + c_01->width);
            pcVar14->depth = (int)p->depth;
            pcVar14->place = (int)p->place;
            fill_rectangle(pcVar14,L'\0',L'\0',pcVar14->height + L'\xffffffff',
                           pcVar14->width + L'\xffffffff',FEAT_GRANITE,L'\0');
            fill_rectangle(pcVar14,L'\0',wVar15,pcVar14->height + L'\xffffffff',x0 + L'\xffffffff',
                           FEAT_PERM,L'\0');
            chunk_copy((chunk_conflict *)pcVar14,p,(chunk_conflict *)c_00,L'\0',L'\0',L'\0',false);
            chunk_copy((chunk_conflict *)pcVar14,p,(chunk_conflict *)c,(h - c->height) / 2,wVar15,
                       L'\0',false);
            chunk_copy((chunk_conflict *)pcVar14,p,(chunk_conflict *)c_01,L'\0',x0,L'\0',false);
            cave_free((chunk_conflict *)c_00);
            cave_free((chunk_conflict *)c);
            cave_free((chunk_conflict *)c_01);
            draw_rectangle(pcVar14,L'\0',L'\0',pcVar14->height + L'\xffffffff',
                           pcVar14->width + L'\xffffffff',FEAT_PERM,L'\0',true);
            ensure_connectedness(pcVar14,true);
            uVar6 = Rand_div(uVar5);
            alloc_objects((chunk_conflict *)pcVar14,L'\x01',L'\0',uVar6 + L'\x01',pcVar14->depth,
                          '\0');
            uVar5 = Rand_div(uVar5);
            alloc_objects((chunk_conflict *)pcVar14,L'\x01',L'\x01',uVar5 + L'\x01',pcVar14->depth,
                          '\0');
            iVar4 = Rand_normal((uint)z_info->room_item_av,3);
            alloc_objects((chunk_conflict *)pcVar14,L'\x02',L'\x03',(int)iVar4,pcVar14->depth,'\x01'
                         );
            iVar4 = Rand_normal((uint)z_info->both_item_av,3);
            alloc_objects((chunk_conflict *)pcVar14,L'\x03',L'\x03',(int)iVar4,pcVar14->depth,'\x01'
                         );
            iVar4 = Rand_normal((uint)z_info->both_gold_av,3);
            alloc_objects((chunk_conflict *)pcVar14,L'\x03',L'\x02',(int)iVar4,pcVar14->depth,'\x01'
                         );
            return pcVar14;
          }
          wVar18 = c->width;
          uVar5 = Rand_div(c->height + L'\xfffffffe');
          lVar10 = (loc)loc(wVar18 + L'\xffffffff',uVar5 + 1);
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
        uncreate_artifacts((chunk_conflict *)c);
        cave_free((chunk_conflict *)c);
        uncreate_artifacts((chunk_conflict *)c_00);
        goto LAB_0014e579;
      }
      uncreate_artifacts((chunk_conflict *)c);
      cave_free((chunk_conflict *)c);
      uncreate_artifacts((chunk_conflict *)c_00);
      cave_free((chunk_conflict *)c_00);
      pcVar13 = "right cavern chunk could not be generated";
    }
  }
LAB_0014e595:
  *p_error = pcVar13;
  return (chunk *)0x0;
code_r0x0014e43d:
  uVar5 = Rand_div(c->height + L'\xfffffffe');
  lVar10 = (loc)loc(0,uVar5 + 1);
  uVar16 = uVar16 + 1;
  if (0x12 < uVar16) goto code_r0x0014e45d;
  goto LAB_0014e413;
code_r0x0014e45d:
  uncreate_artifacts((chunk_conflict *)c);
  cave_free((chunk_conflict *)c);
  uncreate_artifacts((chunk_conflict *)c_00);
LAB_0014e579:
  cave_free((chunk_conflict *)c_00);
  uncreate_artifacts((chunk_conflict *)c_01);
  cave_free((chunk_conflict *)c_01);
  pcVar13 = "could not open entrance to the labyrinth";
  goto LAB_0014e595;
}

Assistant:

struct chunk *gauntlet_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	struct chunk *c;
	struct chunk *left;
	struct chunk *gauntlet;
	struct chunk *right;
	struct chunk *arrival;
	int gauntlet_hgt = 2 * randint1(5) + 3;
	int gauntlet_wid = 2 * randint1(10) + 19;
	int y_size = z_info->dungeon_hgt - randint0(25 - gauntlet_hgt);
	/*
	 * labyrinth_gen() generates something that's two grids wider than
	 * the argument passed, thus the extra "- 2" below.
	 */
	int x_size = (z_info->dungeon_wid - gauntlet_wid - 2) / 2 -
		randint0(45 - gauntlet_wid);
	struct loc p_loc_in_r, p_loc_in_l;
	int line1, line2;

	/* No persistent levels of this type for now */
	if (dun->persist) {
		*p_error = "no gauntlet levels in persistent dungeons";
		return NULL;
	}

	gauntlet = labyrinth_chunk(p, gauntlet_hgt, gauntlet_wid, false, false);
	if (!gauntlet) {
		*p_error = "labyrinth chunk could not be generated";
		return NULL;
	}

	left = cavern_chunk(p, y_size, x_size, NULL);
	if (!left) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		*p_error = "left cavern chunk could not be generated";
		return NULL;
	}

	right = cavern_chunk(p, y_size, x_size, NULL);
	if (!right) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		uncreate_artifacts(left);
		cave_free(left);
		*p_error = "right cavern chunk could not be generated";
		return NULL;
	}

	/* Record lines between chunks */
	line1 = left->width;
	line2 = line1 + gauntlet->width;

	/* Set the movement and mapping restrictions */
	generate_mark(left, 0, 0, left->height - 1, left->width - 1,
		SQUARE_NO_TELEPORT);
	generate_mark(gauntlet, 0, 0, gauntlet->height - 1, gauntlet->width - 1,
		SQUARE_NO_MAP);
	generate_mark(gauntlet, 0, 0, gauntlet->height - 1, gauntlet->width - 1,
		SQUARE_NO_TELEPORT);

	/* Place down stairs in the right cavern */
	alloc_stairs(right, FEAT_MORE, rand_range(2, 3), 0, false, NULL);

	/* Place up stairs in the left cavern */
	alloc_stairs(left, FEAT_LESS, rand_range(1, 3), 0, false, NULL);

	/*
	 * Open the ends of the gauntlet.  Make sure the opening is
	 * horizontally adjacent to a non-permanent wall for interoperability
	 * with ensure_connectedness().
	 */
	i = 0;
	while (1) {
		struct loc grid = loc(0, randint1(gauntlet->height - 2));

		if (i >= 20) {
			uncreate_artifacts(gauntlet);
			cave_free(gauntlet);
			uncreate_artifacts(left);
			cave_free(left);
			uncreate_artifacts(right);
			cave_free(right);
			*p_error = "could not open entrance to the labyrinth";
			return NULL;
		}
		if (!square_isperm(gauntlet, loc_sum(grid, loc(1, 0)))) {
			square_set_feat(gauntlet, grid, FEAT_GRANITE);
			break;
		}
		++i;
	}
	i = 0;
	while (1) {
		struct loc grid = loc(gauntlet->width - 1,
			randint1(gauntlet->height - 2));

		if (i >= 20) {
			uncreate_artifacts(gauntlet);
			cave_free(gauntlet);
			uncreate_artifacts(left);
			cave_free(left);
			uncreate_artifacts(right);
			cave_free(right);
			*p_error = "could not open entrance to the labyrinth";
			return NULL;
		}
		if (!square_isperm(gauntlet, loc_sum(grid, loc(-1, 0)))) {
			square_set_feat(gauntlet, grid, FEAT_GRANITE);
			break;
		}
		++i;
	}

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(p->depth / 3, 10), 2) / 2;

	/* Put the character in the arrival cavern */
	arrival = (p->upkeep->create_stair == FEAT_MORE) ? right : left;
	if (!new_player_spot(arrival, p)) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		uncreate_artifacts(left);
		cave_free(left);
		uncreate_artifacts(right);
		cave_free(right);
		*p_error = "could not place player";
		return NULL;
	}
	/*
	 * Account for the player's location relative to the right and left
	 * chunks for use in pick_and_place_distant_monster().  The
	 * transformations here have to match what the calls to chunk_copy()
	 * below do.
	 */
	if (arrival == right) {
		p_loc_in_r = p->grid;
		p_loc_in_l.x = line2 + p->grid.x;
		p_loc_in_l.y = p->grid.y;
	} else {
		p_loc_in_l = p->grid;
		p_loc_in_r.x = p->grid.x - line2;
		p_loc_in_r.y = p->grid.y;
	}

	/* Pick some monsters for the left cavern */
	i = z_info->level_monster_min + randint1(4) + k;

	/* Place the monsters */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(left, p_loc_in_l, 0, true,
			left->depth);
	}

	/* Pick some of monsters for the right cavern */
	i = z_info->level_monster_min + randint1(4) + k;

	/* Place the monsters */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(right, p_loc_in_r, 0, true,
			right->depth);
	}

	/* Pick a larger number of monsters for the gauntlet */
	i = (z_info->level_monster_min + randint1(6) + k);

	/* Find appropriate monsters */
	while (true) {
		/* Choose a pit profile */
		set_pit_type(gauntlet->depth, 0);

		/* Set monster generation restrictions */
		if (mon_restrict(dun->pit_type->name, gauntlet->depth, gauntlet->depth, true))
			break;
	}

	ROOM_LOG("Gauntlet - %s", dun->pit_type->name);

	/* Place labyrinth monsters */
	spread_monsters(gauntlet, dun->pit_type->name, gauntlet->depth, i,
					gauntlet->height / 2, gauntlet->width / 2,
					gauntlet->height / 2, gauntlet->width / 2,
					ORIGIN_LABYRINTH);

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, gauntlet->depth, gauntlet->depth, false);

	/* Make the level */
	c = cave_new(y_size, left->width + gauntlet->width + right->width);
	c->depth = p->depth;
	c->place = p->place;

	/* Fill cave area with basic granite */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_GRANITE, SQUARE_NONE);

	/* Fill the area between the caverns with permanent rock */
	fill_rectangle(c, 0, line1, c->height - 1, line2 - 1, FEAT_PERM,
		SQUARE_NONE);

	/* Copy in the pieces */
	chunk_copy(c, p, left, 0, 0, 0, false);
	chunk_copy(c, p, gauntlet, (y_size - gauntlet->height) / 2, line1, 0, false);
	chunk_copy(c, p, right, 0, line2, 0, false);

	/* Free the chunks */
	cave_free(left);
	cave_free(gauntlet);
	cave_free(right);

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect */
	ensure_connectedness(c, true);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k), c->depth, 0);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}